

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffgstm(char *timestr,int *timeref,int *status)

{
  tm *local_38;
  tm *ptr;
  time_t tp;
  int *status_local;
  int *timeref_local;
  char *timestr_local;
  
  if (*status < 1) {
    tp = (time_t)status;
    status_local = timeref;
    timeref_local = (int *)timestr;
    time((time_t *)&ptr);
    local_38 = gmtime((time_t *)&ptr);
    if (status_local != (int *)0x0) {
      if (local_38 == (tm *)0x0) {
        *status_local = 1;
      }
      else {
        *status_local = 0;
      }
    }
    if (local_38 == (tm *)0x0) {
      local_38 = localtime((time_t *)&ptr);
    }
    strftime((char *)timeref_local,0x19,"%Y-%m-%dT%H:%M:%S",local_38);
    timestr_local._4_4_ = *(int *)tp;
  }
  else {
    timestr_local._4_4_ = *status;
  }
  return timestr_local._4_4_;
}

Assistant:

int ffgstm( char *timestr,   /* O  - returned system date and time string  */
            int  *timeref,   /* O - GMT = 0, Local time = 1  */
            int   *status)   /* IO - error status      */
/*
  Returns the current date and time in format 'yyyy-mm-ddThh:mm:ss'.
*/
{
    time_t tp;
    struct tm *ptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    time(&tp);
    ptr = gmtime(&tp);         /* get GMT (= UTC) time */

    if (timeref)
    {
        if (ptr)
            *timeref = 0;   /* returning GMT */
        else
            *timeref = 1;   /* returning local time */
    }

    if (!ptr)                  /* GMT not available on this machine */
        ptr = localtime(&tp); 

    strftime(timestr, 25, "%Y-%m-%dT%H:%M:%S", ptr);

    return(*status);
}